

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O3

uint8_t __thiscall AmpIO::GetEncoderIndex(AmpIO *this)

{
  byte bVar1;
  uint32_t uVar2;
  ulong uVar3;
  
  uVar2 = BoardIO::GetHardwareVersion((BoardIO *)this);
  if (uVar2 == 0x44514c41) {
    if ((ulong)this->NumEncoders == 0) {
      bVar1 = 0;
    }
    else {
      uVar3 = 0;
      bVar1 = 0;
      do {
        bVar1 = bVar1 | (byte)(1 << ((byte)uVar3 & 0x1f)) &
                        (char)(*(char *)((long)this->ReadBuffer +
                                        (ulong)(this->ENC_POS_OFFSET + (int)uVar3) * 4 + 3) * '\x02'
                              ) >> 7;
        uVar3 = uVar3 + 1;
      } while (this->NumEncoders != uVar3);
    }
  }
  else {
    bVar1 = *(byte *)((long)this->ReadBuffer + 10) & 0xf;
  }
  return bVar1;
}

Assistant:

uint8_t AmpIO::GetEncoderIndex(void) const
{
    uint8_t encI;
    if (GetHardwareVersion() == DQLA_String) {
        // This also works for QLA with Rev 8+
        encI = 0;
        for (unsigned int i = 0; i < NumEncoders; i++) {
            if (ReadBuffer[ENC_POS_OFFSET+i]&ENC_I_MASK)
                encI |= (1 << i);
        }
    }
    else {
        encI =  static_cast<uint8_t>((this->GetDigitalInput()&0x000f0000)>>16);
    }
    return encI;
}